

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

vector<Node_*,_std::allocator<Node_*>_> * __thiscall
State::RootNodes(vector<Node_*,_std::allocator<Node_*>_> *__return_storage_ptr__,State *this,
                string *err)

{
  bool bVar1;
  reference ppEVar2;
  reference ppNVar3;
  vector<Edge_*,_std::allocator<Edge_*>_> *this_00;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_50;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_48;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_40;
  const_iterator out;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_30;
  const_iterator e;
  string *err_local;
  State *this_local;
  vector<Node_*,_std::allocator<Node_*>_> *root_nodes;
  
  e._M_current._7_1_ = 0;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(__return_storage_ptr__);
  local_30._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(&this->edges_);
  while( true ) {
    out._M_current = (Node **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(&this->edges_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                        *)&out);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_30);
    local_48._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&(*ppEVar2)->outputs_);
    __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
    __normal_iterator<Node**>
              ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)&local_40,
               &local_48);
    while( true ) {
      ppEVar2 = __gnu_cxx::
                __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                operator*(&local_30);
      local_50._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&(*ppEVar2)->outputs_);
      bVar1 = __gnu_cxx::operator!=(&local_40,&local_50);
      if (!bVar1) break;
      ppNVar3 = __gnu_cxx::
                __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                operator*(&local_40);
      this_00 = Node::out_edges(*ppNVar3);
      bVar1 = std::vector<Edge_*,_std::allocator<Edge_*>_>::empty(this_00);
      if (bVar1) {
        ppNVar3 = __gnu_cxx::
                  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_40);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back(__return_storage_ptr__,ppNVar3);
      }
      __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_40);
    }
    __gnu_cxx::__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
    operator++(&local_30);
  }
  bVar1 = std::vector<Edge_*,_std::allocator<Edge_*>_>::empty(&this->edges_);
  if ((!bVar1) &&
     (bVar1 = std::vector<Node_*,_std::allocator<Node_*>_>::empty(__return_storage_ptr__), bVar1)) {
    std::__cxx11::string::operator=((string *)err,"could not determine root nodes of build graph");
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Node*> State::RootNodes(string* err) const {
  vector<Node*> root_nodes;
  // Search for nodes with no output.
  for (vector<Edge*>::const_iterator e = edges_.begin();
       e != edges_.end(); ++e) {
    for (vector<Node*>::const_iterator out = (*e)->outputs_.begin();
         out != (*e)->outputs_.end(); ++out) {
      if ((*out)->out_edges().empty())
        root_nodes.push_back(*out);
    }
  }

  if (!edges_.empty() && root_nodes.empty())
    *err = "could not determine root nodes of build graph";

  return root_nodes;
}